

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::setdashorder(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  pointer piVar1;
  SCell *pSVar2;
  uint uVar3;
  int iVar4;
  uint local_2c;
  
  requireDStackDepth(this,1,"SET-ORDER");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar3 == 0xffffffff) {
    std::vector<int,_std::allocator<int>_>::resize(&this->searchOrder,2);
    pSVar2 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pSVar2 = this->widForthWordList;
    pSVar2[1] = this->widForthWordList;
  }
  else {
    requireDStackDepth(this,(long)(int)uVar3,"SET-ORDER");
    piVar1 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar1) {
      (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar1;
    }
    if (0 < (int)uVar3) {
      iVar4 = uVar3 + 1;
      do {
        uVar3 = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        local_2c = uVar3;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&this->searchOrder,
                   (const_iterator)
                   (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(value_type_conflict4 *)&local_2c);
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
  }
  return;
}

Assistant:

void setdashorder(){
			REQUIRE_DSTACK_DEPTH(1, "SET-ORDER");
			SCell n=dStack.getTop();pop();
			if(n==-1){
				only(); // -1 SET-ORDER and ONLY must have the same behaviour
			} else {
			REQUIRE_DSTACK_DEPTH(n, "SET-ORDER");
			searchOrder.clear();
			while(n>0){
				--n;
				Cell wid=dStack.getTop();pop();
				searchOrder.insert(searchOrder.begin(),wid);
			}
			}
		}